

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Spc_Filter.cpp
# Opt level: O2

void __thiscall SPC_Filter::run(SPC_Filter *this,short *io,int count)

{
  long lVar1;
  short *psVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  long lVar8;
  int i;
  long lVar9;
  int iVar10;
  short sVar11;
  short sVar12;
  
  iVar3 = this->gain;
  if (this->enabled == true) {
    iVar4 = this->bass;
    lVar8 = 0x24;
    do {
      lVar1 = lVar8 + -0xc;
      iVar5 = *(int *)((long)(this->ch + -2) + lVar8);
      iVar10 = *(int *)((long)this->ch + lVar8 + -0x10);
      iVar7 = *(int *)((long)this->ch + lVar8 + -0x14);
      for (lVar9 = 0; lVar9 < count; lVar9 = lVar9 + 2) {
        iVar6 = iVar5 + io[lVar9];
        iVar5 = io[lVar9] * 3;
        sVar12 = (short)(iVar10 >> 10);
        sVar11 = (iVar10 < 0) + 0x7fff;
        if ((int)sVar12 == iVar10 >> 10) {
          sVar11 = sVar12;
        }
        io[lVar9] = sVar11;
        iVar10 = (iVar10 - (iVar10 >> ((byte)iVar4 & 0x1f))) + (iVar6 - iVar7) * iVar3;
        iVar7 = iVar6;
      }
      *(int *)((long)(this->ch + -2) + lVar8) = iVar5;
      *(int *)((long)this->ch + lVar8 + -0x14) = iVar7;
      *(int *)((long)this->ch + lVar8 + -0x10) = iVar10;
      io = io + 1;
      lVar8 = lVar1;
    } while (lVar1 != 0xc);
  }
  else if (iVar3 != 0x100) {
    psVar2 = io + count;
    for (; io < psVar2; io = io + 1) {
      iVar5 = *io * iVar3;
      iVar4 = (iVar5 < 0) + 0x7fff;
      if ((int)(short)((uint)iVar5 >> 8) == iVar5 >> 8) {
        iVar4 = iVar5 >> 8;
      }
      *io = (short)iVar4;
    }
  }
  return;
}

Assistant:

void SPC_Filter::run( short* io, int count )
{
	require( (count & 1) == 0 ); // must be even
	
	int const gain = this->gain;
	if ( enabled )
	{
		int const bass = this->bass;
		chan_t* c = &ch [2];
		do
		{
			// cache in registers
			int sum = (--c)->sum;
			int pp1 = c->pp1;
			int p1  = c->p1;
			
			for ( int i = 0; i < count; i += 2 )
			{
				// Low-pass filter (two point FIR with coeffs 0.25, 0.75)
				int f = io [i] + p1;
				p1 = io [i] * 3;
				
				// High-pass filter ("leaky integrator")
				int delta = f - pp1;
				pp1 = f;
				int s = sum >> (gain_bits + 2);
				sum += (delta * gain) - (sum >> bass);
				
				// Clamp to 16 bits
				if ( (short) s != s )
					s = (s >> 31) ^ 0x7FFF;
				
				io [i] = (short) s;
			}
			
			c->p1  = p1;
			c->pp1 = pp1;
			c->sum = sum;
			++io;
		}
		while ( c != ch );
	}
	else if ( gain != gain_unit )
	{
		short* const end = io + count;
		while ( io < end )
		{
			int s = (*io * gain) >> gain_bits;
			if ( (short) s != s )
				s = (s >> 31) ^ 0x7FFF;
			*io++ = (short) s;
		}
	}
}